

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  xmlRelaxNGGrammarPtr_conflict pxVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  int iVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlChar *pxVar5;
  xmlHashTablePtr pxVar6;
  void *pvVar7;
  xmlRelaxNGGrammarPtr_conflict pxVar8;
  xmlRelaxNGDefinePtr_conflict tmp_2;
  xmlRelaxNGDefinePtr_conflict prev_1;
  int tmp_1;
  xmlRelaxNGGrammarPtr_conflict oldparent;
  xmlRelaxNGGrammarPtr_conflict old;
  xmlRelaxNGGrammarPtr_conflict grammar;
  xmlRelaxNGDefinePtr_conflict prev;
  xmlRelaxNGDefinePtr_conflict pxStack_28;
  int tmp;
  xmlRelaxNGDefinePtr_conflict def;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) || (node->type != XML_ELEMENT_NODE)
      ) || ((iVar3 = xmlStrEqual(node->name,"element"), iVar3 == 0 ||
            (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
    if ((((node == (xmlNodePtr)0x0) ||
         ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))) ||
        (iVar3 = xmlStrEqual(node->name,"attribute"), iVar3 == 0)) ||
       (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)) {
      if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
          (node->type != XML_ELEMENT_NODE)) ||
         ((iVar3 = xmlStrEqual(node->name,"empty"), iVar3 == 0 ||
          (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
        if (((node == (xmlNodePtr)0x0) ||
            ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))) ||
           ((iVar3 = xmlStrEqual(node->name,"text"), iVar3 == 0 ||
            (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
          if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
              (node->type != XML_ELEMENT_NODE)) ||
             ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"zeroOrMore"), iVar3 == 0 ||
              (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
            if (((node == (xmlNodePtr)0x0) ||
                ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))) ||
               ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"oneOrMore"), iVar3 == 0 ||
                (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
              if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                  (node->type != XML_ELEMENT_NODE)) ||
                 ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"optional"), iVar3 == 0 ||
                  (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
                if ((((node == (xmlNodePtr)0x0) ||
                     ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))) ||
                    (iVar3 = xmlStrEqual(node->name,(xmlChar *)"choice"), iVar3 == 0)) ||
                   (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)) {
                  if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                      (node->type != XML_ELEMENT_NODE)) ||
                     ((iVar3 = xmlStrEqual(node->name,"group"), iVar3 == 0 ||
                      (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
                    if (((node == (xmlNodePtr)0x0) ||
                        ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))) ||
                       ((iVar3 = xmlStrEqual(node->name,"ref"), iVar3 == 0 ||
                        (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
                      if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                          (node->type != XML_ELEMENT_NODE)) ||
                         ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"data"), iVar3 == 0 ||
                          (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
                        if (((node == (xmlNodePtr)0x0) ||
                            ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))) ||
                           ((iVar3 = xmlStrEqual(node->name,"value"), iVar3 == 0 ||
                            (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
                          if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                              (node->type != XML_ELEMENT_NODE)) ||
                             ((iVar3 = xmlStrEqual(node->name,"list"), iVar3 == 0 ||
                              (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
                            if ((((node == (xmlNodePtr)0x0) ||
                                 ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE))))
                                || (iVar3 = xmlStrEqual(node->name,(xmlChar *)"interleave"),
                                   iVar3 == 0)) ||
                               (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)) {
                              if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                                  (node->type != XML_ELEMENT_NODE)) ||
                                 ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"externalRef"),
                                  iVar3 == 0 ||
                                  (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0))))
                              {
                                if (((node == (xmlNodePtr)0x0) ||
                                    ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))
                                    ) || ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"notAllowed"),
                                          iVar3 == 0 ||
                                          (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs),
                                          iVar3 == 0)))) {
                                  if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                                      (node->type != XML_ELEMENT_NODE)) ||
                                     ((iVar3 = xmlStrEqual(node->name,"grammar"), iVar3 == 0 ||
                                      (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)
                                      ))) {
                                    if (((node == (xmlNodePtr)0x0) ||
                                        ((node->ns == (xmlNs *)0x0 ||
                                         (node->type != XML_ELEMENT_NODE)))) ||
                                       ((iVar3 = xmlStrEqual(node->name,"parentRef"), iVar3 == 0 ||
                                        (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs),
                                        iVar3 == 0)))) {
                                      if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0))
                                          || (node->type != XML_ELEMENT_NODE)) ||
                                         ((iVar3 = xmlStrEqual(node->name,(xmlChar *)"mixed"),
                                          iVar3 == 0 ||
                                          (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs),
                                          iVar3 == 0)))) {
                                        xmlRngPErr(ctxt,node,0x45b,
                                                   "Unexpected node %s is not a pattern\n",
                                                   node->name,(xmlChar *)0x0);
                                        pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                      }
                                      else if (node->children == (_xmlNode *)0x0) {
                                        xmlRngPErr(ctxt,node,0x3ff,"Mixed is empty\n",(xmlChar *)0x0
                                                   ,(xmlChar *)0x0);
                                        pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                      }
                                      else {
                                        pxStack_28 = xmlRelaxNGParseInterleave(ctxt,node);
                                        if (pxStack_28 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                                          if (((pxStack_28->content != (xmlRelaxNGDefinePtr)0x0) &&
                                              (pxStack_28->content->next != (xmlRelaxNGDefinePtr)0x0
                                              )) && (pxVar4 = xmlRelaxNGNewDefine(ctxt,node),
                                                    pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
                                            pxVar4->type = XML_RELAXNG_GROUP;
                                            pxVar4->content = pxStack_28->content;
                                            pxStack_28->content = pxVar4;
                                          }
                                          pxVar4 = xmlRelaxNGNewDefine(ctxt,node);
                                          if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                            return pxStack_28;
                                          }
                                          pxVar4->type = XML_RELAXNG_TEXT;
                                          pxVar4->next = pxStack_28->content;
                                          pxStack_28->content = pxVar4;
                                        }
                                      }
                                    }
                                    else {
                                      if (ctxt->parentgrammar == (xmlRelaxNGGrammarPtr_conflict)0x0)
                                      {
                                        xmlRngPErr(ctxt,node,0x427,
                                                   "Use of parentRef without a parent grammar\n",
                                                   (xmlChar *)0x0,(xmlChar *)0x0);
                                        return (xmlRelaxNGDefinePtr_conflict)0x0;
                                      }
                                      pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
                                      if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                        return (xmlRelaxNGDefinePtr_conflict)0x0;
                                      }
                                      pxStack_28->type = XML_RELAXNG_PARENTREF;
                                      pxVar5 = xmlGetProp(node,"name");
                                      pxStack_28->name = pxVar5;
                                      if (pxStack_28->name == (xmlChar *)0x0) {
                                        xmlRngPErr(ctxt,node,0x426,"parentRef has no name\n",
                                                   (xmlChar *)0x0,(xmlChar *)0x0);
                                      }
                                      else {
                                        xmlRelaxNGNormExtSpace(pxStack_28->name);
                                        iVar3 = xmlValidateNCName(pxStack_28->name,0);
                                        if (iVar3 != 0) {
                                          xmlRngPErr(ctxt,node,0x425,
                                                     "parentRef name \'%s\' is not an NCName\n",
                                                     pxStack_28->name,(xmlChar *)0x0);
                                        }
                                      }
                                      if (node->children != (_xmlNode *)0x0) {
                                        xmlRngPErr(ctxt,node,0x428,"parentRef is not empty\n",
                                                   (xmlChar *)0x0,(xmlChar *)0x0);
                                      }
                                      if (ctxt->parentgrammar->refs == (xmlHashTablePtr)0x0) {
                                        pxVar6 = xmlHashCreate(10);
                                        ctxt->parentgrammar->refs = pxVar6;
                                      }
                                      if (ctxt->parentgrammar->refs == (xmlHashTablePtr)0x0) {
                                        xmlRngPErr(ctxt,node,0x424,
                                                   "Could not create references hash\n",
                                                   (xmlChar *)0x0,(xmlChar *)0x0);
                                        pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                      }
                                      else if ((pxStack_28->name != (xmlChar *)0x0) &&
                                              (iVar3 = xmlHashAddEntry(ctxt->parentgrammar->refs,
                                                                       pxStack_28->name,pxStack_28),
                                              iVar3 < 0)) {
                                        pvVar7 = xmlHashLookup(ctxt->parentgrammar->refs,
                                                               pxStack_28->name);
                                        if (pvVar7 == (void *)0x0) {
                                          xmlRngPErr(ctxt,node,0x424,
                                                     "Internal error parentRef definitions \'%s\'\n"
                                                     ,pxStack_28->name,(xmlChar *)0x0);
                                          pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                        }
                                        else {
                                          pxStack_28->nextHash =
                                               *(xmlRelaxNGDefinePtr *)((long)pvVar7 + 0x58);
                                          *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar7 + 0x58) =
                                               pxStack_28;
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    pxVar1 = ctxt->parentgrammar;
                                    pxVar2 = ctxt->grammar;
                                    ctxt->parentgrammar = pxVar2;
                                    pxVar8 = xmlRelaxNGParseGrammar(ctxt,node->children);
                                    if (pxVar2 != (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                      ctxt->grammar = pxVar2;
                                      ctxt->parentgrammar = pxVar1;
                                    }
                                    if (pxVar8 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                      pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                    }
                                    else {
                                      pxStack_28 = pxVar8->start;
                                    }
                                  }
                                }
                                else {
                                  pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
                                  if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                    return (xmlRelaxNGDefinePtr_conflict)0x0;
                                  }
                                  pxStack_28->type = XML_RELAXNG_NOT_ALLOWED;
                                  if (node->children != (_xmlNode *)0x0) {
                                    xmlRngPErr(ctxt,node,0x41f,
                                               "xmlRelaxNGParse: notAllowed element is not empty\n",
                                               (xmlChar *)0x0,(xmlChar *)0x0);
                                  }
                                }
                              }
                              else {
                                pxStack_28 = xmlRelaxNGProcessExternalRef(ctxt,node);
                              }
                            }
                            else {
                              pxStack_28 = xmlRelaxNGParseInterleave(ctxt,node);
                            }
                          }
                          else {
                            pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
                            if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                              return (xmlRelaxNGDefinePtr_conflict)0x0;
                            }
                            pxStack_28->type = XML_RELAXNG_LIST;
                            if (node->children == (_xmlNode *)0x0) {
                              xmlRngPErr(ctxt,node,0x3ff,"Element %s is empty\n",node->name,
                                         (xmlChar *)0x0);
                            }
                            else {
                              pxVar4 = xmlRelaxNGParsePatterns(ctxt,node->children,0);
                              pxStack_28->content = pxVar4;
                            }
                          }
                        }
                        else {
                          pxStack_28 = xmlRelaxNGParseValue(ctxt,node);
                        }
                      }
                      else {
                        pxStack_28 = xmlRelaxNGParseData(ctxt,node);
                      }
                    }
                    else {
                      pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
                      if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                        return (xmlRelaxNGDefinePtr_conflict)0x0;
                      }
                      pxStack_28->type = XML_RELAXNG_REF;
                      pxVar5 = xmlGetProp(node,"name");
                      pxStack_28->name = pxVar5;
                      if (pxStack_28->name == (xmlChar *)0x0) {
                        xmlRngPErr(ctxt,node,0x44e,"ref has no name\n",(xmlChar *)0x0,(xmlChar *)0x0
                                  );
                      }
                      else {
                        xmlRelaxNGNormExtSpace(pxStack_28->name);
                        iVar3 = xmlValidateNCName(pxStack_28->name,0);
                        if (iVar3 != 0) {
                          xmlRngPErr(ctxt,node,0x44c,"ref name \'%s\' is not an NCName\n",
                                     pxStack_28->name,(xmlChar *)0x0);
                        }
                      }
                      if (node->children != (_xmlNode *)0x0) {
                        xmlRngPErr(ctxt,node,0x44f,"ref is not empty\n",(xmlChar *)0x0,
                                   (xmlChar *)0x0);
                      }
                      if (ctxt->grammar->refs == (xmlHashTablePtr)0x0) {
                        pxVar6 = xmlHashCreate(10);
                        ctxt->grammar->refs = pxVar6;
                      }
                      if (ctxt->grammar->refs == (xmlHashTablePtr)0x0) {
                        xmlRngPErr(ctxt,node,0x44a,"Could not create references hash\n",
                                   (xmlChar *)0x0,(xmlChar *)0x0);
                        pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
                      }
                      else {
                        iVar3 = xmlHashAddEntry(ctxt->grammar->refs,pxStack_28->name,pxStack_28);
                        if (iVar3 < 0) {
                          pvVar7 = xmlHashLookup(ctxt->grammar->refs,pxStack_28->name);
                          if (pvVar7 == (void *)0x0) {
                            if (pxStack_28->name == (xmlChar *)0x0) {
                              xmlRngPErr(ctxt,node,0x44a,"Error refs definitions\n",(xmlChar *)0x0,
                                         (xmlChar *)0x0);
                            }
                            else {
                              xmlRngPErr(ctxt,node,0x44a,"Error refs definitions \'%s\'\n",
                                         pxStack_28->name,(xmlChar *)0x0);
                            }
                            pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
                          }
                          else {
                            pxStack_28->nextHash = *(xmlRelaxNGDefinePtr *)((long)pvVar7 + 0x58);
                            *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar7 + 0x58) = pxStack_28;
                          }
                        }
                      }
                    }
                  }
                  else {
                    pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
                    if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                      return (xmlRelaxNGDefinePtr_conflict)0x0;
                    }
                    pxStack_28->type = XML_RELAXNG_GROUP;
                    if (node->children == (_xmlNode *)0x0) {
                      xmlRngPErr(ctxt,node,0x3ff,"Element %s is empty\n",node->name,(xmlChar *)0x0);
                    }
                    else {
                      pxVar4 = xmlRelaxNGParsePatterns(ctxt,node->children,0);
                      pxStack_28->content = pxVar4;
                    }
                  }
                }
                else {
                  pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
                  if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                    return (xmlRelaxNGDefinePtr_conflict)0x0;
                  }
                  pxStack_28->type = XML_RELAXNG_CHOICE;
                  if (node->children == (_xmlNode *)0x0) {
                    xmlRngPErr(ctxt,node,0x3ff,"Element %s is empty\n",node->name,(xmlChar *)0x0);
                  }
                  else {
                    pxVar4 = xmlRelaxNGParsePatterns(ctxt,node->children,0);
                    pxStack_28->content = pxVar4;
                  }
                }
              }
              else {
                pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
                if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                  return (xmlRelaxNGDefinePtr_conflict)0x0;
                }
                pxStack_28->type = XML_RELAXNG_OPTIONAL;
                if (node->children == (_xmlNode *)0x0) {
                  xmlRngPErr(ctxt,node,0x3ff,"Element %s is empty\n",node->name,(xmlChar *)0x0);
                }
                else {
                  pxVar4 = xmlRelaxNGParsePatterns(ctxt,node->children,1);
                  pxStack_28->content = pxVar4;
                }
              }
            }
            else {
              pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
              if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                return (xmlRelaxNGDefinePtr_conflict)0x0;
              }
              pxStack_28->type = XML_RELAXNG_ONEORMORE;
              if (node->children == (_xmlNode *)0x0) {
                xmlRngPErr(ctxt,node,0x3ff,"Element %s is empty\n",node->name,(xmlChar *)0x0);
              }
              else {
                pxVar4 = xmlRelaxNGParsePatterns(ctxt,node->children,1);
                pxStack_28->content = pxVar4;
              }
            }
          }
          else {
            pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
            if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
              return (xmlRelaxNGDefinePtr_conflict)0x0;
            }
            pxStack_28->type = XML_RELAXNG_ZEROORMORE;
            if (node->children == (_xmlNode *)0x0) {
              xmlRngPErr(ctxt,node,0x3ff,"Element %s is empty\n",node->name,(xmlChar *)0x0);
            }
            else {
              pxVar4 = xmlRelaxNGParsePatterns(ctxt,node->children,1);
              pxStack_28->content = pxVar4;
            }
          }
        }
        else {
          pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
          if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          pxStack_28->type = XML_RELAXNG_TEXT;
          if (node->children != (_xmlNode *)0x0) {
            xmlRngPErr(ctxt,node,0x455,"text: had a child node\n",(xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
      }
      else {
        pxStack_28 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxStack_28->type = XML_RELAXNG_EMPTY;
        if (node->children != (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x401,"empty: had a child node\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
    }
    else {
      pxStack_28 = xmlRelaxNGParseAttribute(ctxt,node);
    }
  }
  else {
    pxStack_28 = xmlRelaxNGParseElement(ctxt,node);
  }
  return pxStack_28;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr def = NULL;

    if (node == NULL) {
        return (NULL);
    }
    if (IS_RELAXNG(node, "element")) {
        def = xmlRelaxNGParseElement(ctxt, node);
    } else if (IS_RELAXNG(node, "attribute")) {
        def = xmlRelaxNGParseAttribute(ctxt, node);
    } else if (IS_RELAXNG(node, "empty")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_EMPTY;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_NOT_EMPTY,
                       "empty: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "text")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_TEXT;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_TEXT_HAS_CHILD,
                       "text: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "zeroOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ZEROORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "oneOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ONEORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "optional")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_OPTIONAL;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "choice")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_CHOICE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "group")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_GROUP;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "ref")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_REF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NO_NAME, "ref has no name\n",
                       NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_REF_NAME_INVALID,
                           "ref name '%s' is not an NCName\n", def->name,
                           NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NOT_EMPTY, "ref is not empty\n",
                       NULL, NULL);
        }
        if (ctxt->grammar->refs == NULL)
            ctxt->grammar->refs = xmlHashCreate(10);
        if (ctxt->grammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else {
            int tmp;

            tmp = xmlHashAddEntry(ctxt->grammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->grammar->refs, def->name);
                if (prev == NULL) {
                    if (def->name != NULL) {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions '%s'\n",
				   def->name, NULL);
                    } else {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions\n",
				   NULL, NULL);
                    }
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "data")) {
        def = xmlRelaxNGParseData(ctxt, node);
    } else if (IS_RELAXNG(node, "value")) {
        def = xmlRelaxNGParseValue(ctxt, node);
    } else if (IS_RELAXNG(node, "list")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_LIST;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "interleave")) {
        def = xmlRelaxNGParseInterleave(ctxt, node);
    } else if (IS_RELAXNG(node, "externalRef")) {
        def = xmlRelaxNGProcessExternalRef(ctxt, node);
    } else if (IS_RELAXNG(node, "notAllowed")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_NOT_ALLOWED;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_NOTALLOWED_NOT_EMPTY,
                       "xmlRelaxNGParse: notAllowed element is not empty\n",
                       NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "grammar")) {
        xmlRelaxNGGrammarPtr grammar, old;
        xmlRelaxNGGrammarPtr oldparent;

        oldparent = ctxt->parentgrammar;
        old = ctxt->grammar;
        ctxt->parentgrammar = old;
        grammar = xmlRelaxNGParseGrammar(ctxt, node->children);
        if (old != NULL) {
            ctxt->grammar = old;
            ctxt->parentgrammar = oldparent;
#if 0
            if (grammar != NULL) {
                grammar->next = old->next;
                old->next = grammar;
            }
#endif
        }
        if (grammar != NULL)
            def = grammar->start;
        else
            def = NULL;
    } else if (IS_RELAXNG(node, "parentRef")) {
        if (ctxt->parentgrammar == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_PARENT,
                       "Use of parentRef without a parent grammar\n", NULL,
                       NULL);
            return (NULL);
        }
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_PARENTREF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_NAME,
                       "parentRef has no name\n", NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NAME_INVALID,
                           "parentRef name '%s' is not an NCName\n",
                           def->name, NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NOT_EMPTY,
                       "parentRef is not empty\n", NULL, NULL);
        }
        if (ctxt->parentgrammar->refs == NULL)
            ctxt->parentgrammar->refs = xmlHashCreate(10);
        if (ctxt->parentgrammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else if (def->name != NULL) {
            int tmp;

            tmp =
                xmlHashAddEntry(ctxt->parentgrammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->parentgrammar->refs, def->name);
                if (prev == NULL) {
                    xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                               "Internal error parentRef definitions '%s'\n",
                               def->name, NULL);
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "mixed")) {
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT, "Mixed is empty\n",
                       NULL, NULL);
            def = NULL;
        } else {
            def = xmlRelaxNGParseInterleave(ctxt, node);
            if (def != NULL) {
                xmlRelaxNGDefinePtr tmp;

                if ((def->content != NULL) && (def->content->next != NULL)) {
                    tmp = xmlRelaxNGNewDefine(ctxt, node);
                    if (tmp != NULL) {
                        tmp->type = XML_RELAXNG_GROUP;
                        tmp->content = def->content;
                        def->content = tmp;
                    }
                }

                tmp = xmlRelaxNGNewDefine(ctxt, node);
                if (tmp == NULL)
                    return (def);
                tmp->type = XML_RELAXNG_TEXT;
                tmp->next = def->content;
                def->content = tmp;
            }
        }
    } else {
        xmlRngPErr(ctxt, node, XML_RNGP_UNKNOWN_CONSTRUCT,
                   "Unexpected node %s is not a pattern\n", node->name,
                   NULL);
        def = NULL;
    }
    return (def);
}